

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovProgram.cpp
# Opt level: O1

void __thiscall
cov::Program::Program
          (Program *this,Context *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources)

{
  ObjectMagic *pOVar1;
  IcdDispatch *pIVar2;
  
  (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>).m_magic = PROGRAM_MAGIC;
  (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>).m_initSuccess = true;
  pIVar2 = getIcdTable();
  (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>).m_icdTable = pIVar2;
  this->m_context = context;
  (this->m_sources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (sources->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->m_sources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (sources->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->m_sources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (sources->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (sources->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (sources->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (sources->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)7>).m_initSuccess = true;
  LOCK();
  pOVar1 = &(this->m_context->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_magic;
  *(int *)pOVar1 = *(int *)pOVar1 + 1;
  UNLOCK();
  return;
}

Assistant:

Program::Program(Context& context, std::vector<std::string>& sources)
    : m_context(context),
      m_sources(std::move(sources))
{
    m_initSuccess = true; // fixme
    if (m_initSuccess) m_context.retain();
}